

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void rand_pk(secp256k1_pubkey *pk)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uchar *key32;
  uchar *keypair_00;
  size_t count;
  undefined8 *extraout_RDX;
  undefined8 *puVar6;
  undefined8 *puVar7;
  size_t len;
  void *ndata;
  size_t msglen;
  long lVar8;
  uchar *msg;
  secp256k1_keypair *psVar9;
  byte *nonce32;
  secp256k1_context *psVar10;
  int iVar11;
  uchar *xonly_pk32;
  uchar *puVar12;
  secp256k1_keypair *psVar13;
  secp256k1_xonly_pubkey *pubkey;
  uchar *algo;
  secp256k1_keypair keypair;
  uchar seckey [32];
  secp256k1_xonly_pubkey sStackY_310;
  uchar *puStackY_2d0;
  uchar *puStackY_2c8;
  uchar *puStackY_2c0;
  code *pcStackY_2b8;
  secp256k1_schnorrsig_extraparams sStack_2a0;
  undefined1 auStack_280 [64];
  undefined1 auStack_240 [160];
  byte abStack_1a0 [64];
  undefined8 *puStack_160;
  byte abStack_138 [32];
  byte abStack_118 [40];
  secp256k1_context *psStack_f0;
  secp256k1_context *psStack_d8;
  long alStack_d0 [5];
  secp256k1_pubkey *psStack_a8;
  code *pcStack_a0;
  secp256k1_keypair sStack_98;
  uchar local_38 [40];
  
  psVar9 = &sStack_98;
  pcStack_a0 = (code *)0x169942;
  secp256k1_testrand256(local_38);
  pcStack_a0 = (code *)0x169954;
  psVar10 = CTX;
  iVar3 = secp256k1_keypair_create(CTX,&sStack_98,local_38);
  if (iVar3 == 0) {
    pcStack_a0 = (code *)0x169995;
    rand_pk_cold_3();
  }
  else if (pk != (secp256k1_pubkey *)0x0) {
    *(undefined8 *)(pk->data + 0x30) = sStack_98.data._80_8_;
    *(undefined8 *)(pk->data + 0x38) = sStack_98.data._88_8_;
    *(undefined8 *)(pk->data + 0x20) = sStack_98.data._64_8_;
    *(undefined8 *)(pk->data + 0x28) = sStack_98.data._72_8_;
    *(undefined8 *)(pk->data + 0x10) = sStack_98.data._48_8_;
    *(undefined8 *)(pk->data + 0x18) = sStack_98.data._56_8_;
    *(undefined8 *)pk->data = sStack_98.data._32_8_;
    *(undefined8 *)(pk->data + 8) = sStack_98.data._40_8_;
    goto LAB_00169980;
  }
  pcStack_a0 = (code *)0x16999a;
  rand_pk_cold_1();
LAB_00169980:
  if (pk != (secp256k1_pubkey *)0x0) {
    return;
  }
  pcStack_a0 = test_sort_helper;
  rand_pk_cold_2();
  pcStack_a0 = (code *)local_38;
  psStack_a8 = pk;
  if (count != 0) {
    sVar5 = 0;
    do {
      alStack_d0[sVar5] =
           (long)((&(psVar10->ecmult_gen_ctx).blind)[*(long *)((long)psVar9 + sVar5 * 8) * 2 + -1].d
                 + 3);
      sVar5 = sVar5 + 1;
    } while (count != sVar5);
  }
  psStack_d8 = CTX;
  secp256k1_hsort(alStack_d0,count,8,secp256k1_pubkey_sort_cmp,&psStack_d8);
  if (count != 0) {
    sVar5 = 0;
    puVar7 = extraout_RDX;
    do {
      lVar8 = 0;
      puVar6 = puVar7;
      do {
        puVar6 = (undefined8 *)((ulong)puVar6 & 0xffffffff);
        bVar1 = *(byte *)((long)(psVar10->ecmult_gen_ctx).blind.d + lVar8 + -8);
        puVar7 = (undefined8 *)(ulong)((uint)*(byte *)(alStack_d0[sVar5] + lVar8) - (uint)bVar1);
        if (*(byte *)(alStack_d0[sVar5] + lVar8) != bVar1) goto LAB_00169a28;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      puVar7 = (undefined8 *)0x0;
LAB_00169a28:
      if ((int)puVar7 != 0) {
        test_sort_helper_cold_1();
        nonce32 = abStack_138;
        msg = (uchar *)*puVar6;
        key32 = (uchar *)puVar6[1];
        xonly_pk32 = (uchar *)puVar6[2];
        algo = (uchar *)puVar6[3];
        psStack_f0 = psVar10;
        iVar3 = nonce_function_bip340
                          (abStack_138,msg,0x20,key32,xonly_pk32,algo,0xd,(void *)puVar6[4]);
        if (iVar3 == 0) {
          nonce_function_bip340_bitflip_cold_3();
        }
        else {
          secp256k1_testrand_flip((uchar *)puVar6[lVar8],len);
          nonce32 = abStack_118;
          msg = (uchar *)*puVar6;
          key32 = (uchar *)puVar6[1];
          xonly_pk32 = (uchar *)puVar6[2];
          algo = (uchar *)puVar6[3];
          lVar8 = 0x20;
          uVar4 = nonce_function_bip340
                            (nonce32,msg,0x20,key32,xonly_pk32,algo,0xd,(void *)puVar6[4]);
          if (uVar4 != 0) goto LAB_00169abd;
        }
        nonce_function_bip340_bitflip_cold_2();
        goto LAB_00169af9;
      }
      sVar5 = sVar5 + 1;
      psVar10 = (secp256k1_context *)((psVar10->ecmult_gen_ctx).initial.x.n + 3);
    } while (sVar5 != count);
  }
  return;
  while (lVar8 = lVar8 + 1, lVar8 != 0x40) {
LAB_00169abd:
    key32 = (uchar *)(ulong)uVar4;
    bVar1 = abStack_138[lVar8];
    msg = (uchar *)(ulong)bVar1;
    iVar3 = (uint)abStack_138[lVar8 + -0x20] - (uint)bVar1;
    if (abStack_138[lVar8 + -0x20] != bVar1) goto LAB_00169ae1;
  }
  iVar3 = 0;
LAB_00169ae1:
  if (iVar3 != 0) {
    return;
  }
LAB_00169af9:
  nonce_function_bip340_bitflip_cold_1();
  sStack_2a0.magic[0] = 0xda;
  sStack_2a0.magic[1] = 'o';
  sStack_2a0.magic[2] = 0xb3;
  sStack_2a0.magic[3] = 0x8c;
  sStack_2a0._4_4_ = 0;
  sStack_2a0.noncefp = (secp256k1_nonce_function_hardened)0x0;
  psVar9 = (secp256k1_keypair *)(auStack_240 + 0x40);
  pcStackY_2b8 = (code *)0x169b45;
  keypair_00 = key32;
  psVar10 = CTX;
  puVar12 = xonly_pk32;
  puStack_160 = puVar6;
  iVar3 = secp256k1_keypair_create(CTX,psVar9,nonce32);
  iVar11 = (int)puVar12;
  if (iVar3 == 0) {
    pcStackY_2b8 = (code *)0x169cbf;
    test_schnorrsig_bip_vectors_check_signing_cold_9();
LAB_00169cbf:
    pcStackY_2b8 = (code *)0x169cc4;
    test_schnorrsig_bip_vectors_check_signing_cold_8();
LAB_00169cc4:
    pcStackY_2b8 = (code *)0x169cc9;
    test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_00169cc9:
    pcStackY_2b8 = (code *)0x169cce;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_00169cce:
    pcStackY_2b8 = (code *)0x169cd3;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
LAB_00169cd3:
    pcStackY_2b8 = (code *)0x169cd8;
    test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_00169cd8:
    pcStackY_2b8 = (code *)0x169cdd;
    test_schnorrsig_bip_vectors_check_signing_cold_4();
  }
  else {
    psVar9 = (secp256k1_keypair *)auStack_280;
    psVar13 = (secp256k1_keypair *)(auStack_240 + 0x40);
    pcStackY_2b8 = (code *)0x169b71;
    keypair_00 = xonly_pk32;
    psVar10 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_custom
                      (CTX,(uchar *)psVar9,key32,(size_t)xonly_pk32,psVar13,&sStack_2a0);
    iVar11 = (int)psVar13;
    if (iVar3 == 0) goto LAB_00169cbf;
    keypair_00 = (uchar *)0x0;
    do {
      bVar1 = auStack_280[(long)keypair_00];
      psVar9 = (secp256k1_keypair *)(ulong)bVar1;
      bVar2 = algo[(long)keypair_00];
      psVar10 = (secp256k1_context *)(ulong)bVar2;
      iVar3 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_00169b9e;
      keypair_00 = keypair_00 + 1;
    } while (keypair_00 != (uchar *)0x40);
    iVar3 = 0;
LAB_00169b9e:
    if (iVar3 != 0) goto LAB_00169cc4;
    if (xonly_pk32 != (uchar *)0x20) {
LAB_00169c1f:
      psVar9 = (secp256k1_keypair *)abStack_1a0;
      pcStackY_2b8 = (code *)0x169c36;
      psVar10 = CTX;
      iVar3 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)psVar9,msg);
      if (iVar3 == 0) goto LAB_00169cc9;
      psVar9 = (secp256k1_keypair *)auStack_240;
      keypair_00 = auStack_240 + 0x40;
      pcStackY_2b8 = (code *)0x169c59;
      psVar10 = CTX;
      iVar3 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)psVar9,(int *)0x0,
                         (secp256k1_keypair *)keypair_00);
      if (iVar3 == 0) goto LAB_00169cce;
      keypair_00 = (uchar *)0x0;
      do {
        bVar1 = auStack_240[(long)keypair_00];
        psVar9 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = abStack_1a0[(long)keypair_00];
        psVar10 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00169c85;
        keypair_00 = keypair_00 + 1;
      } while (keypair_00 != (uchar *)0x40);
      iVar3 = 0;
LAB_00169c85:
      if (iVar3 != 0) goto LAB_00169cd3;
      psVar9 = (secp256k1_keypair *)auStack_280;
      pubkey = (secp256k1_xonly_pubkey *)auStack_240;
      pcStackY_2b8 = (code *)0x169ca5;
      keypair_00 = xonly_pk32;
      psVar10 = CTX;
      iVar3 = secp256k1_schnorrsig_verify(CTX,(uchar *)psVar9,key32,(size_t)xonly_pk32,pubkey);
      iVar11 = (int)pubkey;
      if (iVar3 != 0) {
        return;
      }
      goto LAB_00169cd8;
    }
    psVar9 = (secp256k1_keypair *)auStack_280;
    auStack_280[0x30] = '\0';
    auStack_280[0x31] = '\0';
    auStack_280[0x32] = '\0';
    auStack_280[0x33] = '\0';
    auStack_280[0x34] = '\0';
    auStack_280[0x35] = '\0';
    auStack_280[0x36] = '\0';
    auStack_280[0x37] = '\0';
    auStack_280[0x38] = '\0';
    auStack_280[0x39] = '\0';
    auStack_280[0x3a] = '\0';
    auStack_280[0x3b] = '\0';
    auStack_280[0x3c] = '\0';
    auStack_280[0x3d] = '\0';
    auStack_280[0x3e] = '\0';
    auStack_280[0x3f] = '\0';
    auStack_280[0x20] = '\0';
    auStack_280[0x21] = '\0';
    auStack_280[0x22] = '\0';
    auStack_280[0x23] = '\0';
    auStack_280[0x24] = '\0';
    auStack_280[0x25] = '\0';
    auStack_280[0x26] = '\0';
    auStack_280[0x27] = '\0';
    auStack_280[0x28] = '\0';
    auStack_280[0x29] = '\0';
    auStack_280[0x2a] = '\0';
    auStack_280[0x2b] = '\0';
    auStack_280[0x2c] = '\0';
    auStack_280[0x2d] = '\0';
    auStack_280[0x2e] = '\0';
    auStack_280[0x2f] = '\0';
    auStack_280[0x10] = '\0';
    auStack_280[0x11] = '\0';
    auStack_280[0x12] = '\0';
    auStack_280[0x13] = '\0';
    auStack_280[0x14] = '\0';
    auStack_280[0x15] = '\0';
    auStack_280[0x16] = '\0';
    auStack_280[0x17] = '\0';
    auStack_280[0x18] = '\0';
    auStack_280[0x19] = '\0';
    auStack_280[0x1a] = '\0';
    auStack_280[0x1b] = '\0';
    auStack_280[0x1c] = '\0';
    auStack_280[0x1d] = '\0';
    auStack_280[0x1e] = '\0';
    auStack_280[0x1f] = '\0';
    auStack_280[0] = '\0';
    auStack_280[1] = '\0';
    auStack_280[2] = '\0';
    auStack_280[3] = '\0';
    auStack_280[4] = '\0';
    auStack_280[5] = '\0';
    auStack_280[6] = '\0';
    auStack_280[7] = '\0';
    auStack_280[8] = '\0';
    auStack_280[9] = '\0';
    auStack_280[10] = '\0';
    auStack_280[0xb] = '\0';
    auStack_280[0xc] = '\0';
    auStack_280[0xd] = '\0';
    auStack_280[0xe] = '\0';
    auStack_280[0xf] = '\0';
    psVar13 = (secp256k1_keypair *)(auStack_240 + 0x40);
    keypair_00 = (uchar *)0x20;
    pcStackY_2b8 = (code *)0x169bea;
    psVar10 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_internal
                      (CTX,(uchar *)psVar9,key32,0x20,psVar13,nonce_function_bip340,ndata);
    iVar11 = (int)psVar13;
    if (iVar3 != 0) {
      keypair_00 = (uchar *)0x0;
      do {
        bVar1 = auStack_280[(long)keypair_00];
        psVar9 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = algo[(long)keypair_00];
        psVar10 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00169c17;
        keypair_00 = keypair_00 + 1;
      } while (keypair_00 != (uchar *)0x40);
      iVar3 = 0;
LAB_00169c17:
      if (iVar3 != 0) goto LAB_00169ce2;
      goto LAB_00169c1f;
    }
  }
  pcStackY_2b8 = (code *)0x169ce2;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_00169ce2:
  pcStackY_2b8 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  puStackY_2d0 = xonly_pk32;
  puStackY_2c8 = algo;
  puStackY_2c0 = key32;
  pcStackY_2b8 = (code *)msg;
  iVar3 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_310,(uchar *)psVar10);
  if (iVar3 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar3 = secp256k1_schnorrsig_verify(CTX,keypair_00,psVar9->data,msglen,&sStackY_310);
    if (iVar3 == iVar11) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void rand_pk(secp256k1_pubkey *pk) {
    unsigned char seckey[32];
    secp256k1_keypair keypair;
    secp256k1_testrand256(seckey);
    CHECK(secp256k1_keypair_create(CTX, &keypair, seckey) == 1);
    CHECK(secp256k1_keypair_pub(CTX, pk, &keypair) == 1);
}